

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcx.c
# Opt level: O0

int pcx_search_tile(uchar *data,int size)

{
  uint uVar1;
  int iVar2;
  t_tile *ptStack_28;
  uint crc;
  t_tile *tile;
  int size_local;
  uchar *data_local;
  
  if (pass == 1) {
    if (tile_lablptr == (t_symbol *)0x0) {
      data_local._4_4_ = -1;
    }
    else if (tile_lablptr->size == size) {
      uVar1 = crc_calc(data,size);
      for (ptStack_28 = tile_tbl[uVar1 & 0xff]; ptStack_28 != (t_tile *)0x0;
          ptStack_28 = ptStack_28->next) {
        if ((ptStack_28->crc == uVar1) &&
           (iVar2 = memcmp(ptStack_28->data,data,(long)size), iVar2 == 0)) {
          return ptStack_28->index;
        }
      }
      data_local._4_4_ = -1;
    }
    else {
      data_local._4_4_ = -1;
    }
  }
  else {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

int
pcx_search_tile(unsigned char *data, int size)
{
	struct t_tile *tile;
	unsigned int crc;

	/* do nothing in first passes */
	if (pass != LAST_PASS)
		return (0);

	/* quick check */
	if (tile_lablptr == NULL)
		return (-1);
	if (tile_lablptr->size != size)
		return (-1);

	/* calculate tile crc */
	crc  = crc_calc(data, size);
	tile = tile_tbl[crc & 0xFF];

	/* search tile */
	while (tile) {
		if (tile->crc == crc) {
			if (memcmp(tile->data, data, size) == 0)
				return(tile->index);
	 	}
		tile = tile->next;
	}

	/* not found */
	return (-1);
}